

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_INT ref_subdiv_c2e(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell_edge,REF_INT cell)

{
  uint uVar1;
  REF_INT local_34;
  REF_STATUS ref_private_macro_code_rse;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT cell_local;
  REF_INT cell_edge_local;
  REF_CELL ref_cell_local;
  REF_SUBDIV ref_subdiv_local;
  
  node1 = cell;
  node0 = cell_edge;
  _cell_local = ref_cell;
  ref_cell_local = (REF_CELL)ref_subdiv;
  if (((cell < 0) || (ref_cell->max <= cell)) || (ref_cell->c2n[ref_cell->size_per * cell] == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x28,
           "ref_subdiv_c2e","invalid cell index");
    ref_subdiv_local._4_4_ = -1;
  }
  else if (cell_edge < ref_cell->edge_per) {
    edge = ref_cell->c2n[ref_cell->e2n[cell_edge << 1] + ref_cell->size_per * cell];
    ref_private_macro_code_rse =
         ref_cell->c2n[ref_cell->e2n[cell_edge * 2 + 1] + ref_cell->size_per * cell];
    uVar1 = ref_edge_with(ref_subdiv->edge,edge,ref_private_macro_code_rse,&local_34);
    if (uVar1 == 0) {
      ref_subdiv_local._4_4_ = local_34;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x2f
             ,"ref_subdiv_c2e",(ulong)uVar1,"look up edge");
      ref_subdiv_local._4_4_ = -1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x29,
           "ref_subdiv_c2e","invalid edge index");
    ref_subdiv_local._4_4_ = -1;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

static REF_INT ref_subdiv_c2e(REF_SUBDIV ref_subdiv, REF_CELL ref_cell,
                              REF_INT cell_edge, REF_INT cell) {
  REF_INT node0, node1, edge;

  RAE(ref_cell_valid(ref_cell, cell), "invalid cell index");
  RAE(cell_edge < ref_cell_edge_per(ref_cell), "invalid edge index");

  node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
  node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);

  RSE(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge),
      "look up edge");

  return edge;
}